

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__rasterize_sorted_edges
               (stbtt__bitmap *result,stbtt__edge *e,int n,int vsubsample,int off_x,int off_y,
               void *userdata)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int in_R9D;
  float fVar2;
  stbtt__active_edge *z_2;
  int m;
  float k;
  float sum;
  stbtt__active_edge *z_1;
  stbtt__active_edge *z;
  stbtt__active_edge **step;
  float scan_y_bottom;
  float scan_y_top;
  float *scanline2;
  float *scanline;
  float scanline_data [129];
  int i;
  int j;
  int y;
  stbtt__active_edge *active;
  stbtt__hheap hh;
  void *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  float in_stack_fffffffffffffd70;
  float in_stack_fffffffffffffd74;
  stbtt__active_edge *in_stack_fffffffffffffd78;
  stbtt__edge *in_stack_fffffffffffffd80;
  stbtt__hheap *hh_00;
  size_t *psVar3;
  undefined1 *local_260;
  undefined1 local_258 [44];
  float in_stack_fffffffffffffdd4;
  stbtt__active_edge *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde4;
  float *in_stack_fffffffffffffde8;
  float *in_stack_fffffffffffffdf0;
  int local_4c;
  int local_48;
  int local_44;
  undefined1 local_40 [32];
  int local_20;
  int local_14;
  long local_10;
  int *local_8;
  
  local_20 = in_R9D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_40 + 8,0,0x18);
  local_40._0_8_ = (stbtt__active_edge *)0x0;
  local_48 = 0;
  if (*local_8 < 0x41) {
    local_260 = local_258;
  }
  else {
    local_260 = (undefined1 *)ImGui::MemAlloc((size_t)in_stack_fffffffffffffd60);
  }
  iVar1 = *local_8;
  local_44 = local_20;
  *(float *)(local_10 + (long)local_14 * 0x14 + 4) = (float)(local_20 + local_8[1]) + 1.0;
  for (; local_48 < local_8[1]; local_48 = local_48 + 1) {
    fVar2 = (float)local_44 + 0.0;
    hh_00 = (stbtt__hheap *)local_40;
    memset(local_260,0,(long)*local_8 << 2);
    memset(local_260 + (long)iVar1 * 4,0,(long)(*local_8 + 1) << 2);
    while (hh_00->head != (stbtt__hheap_chunk *)0x0) {
      in_stack_fffffffffffffd80 = (stbtt__edge *)hh_00->head;
      if (fVar2 < in_stack_fffffffffffffd80[1].x1) {
        hh_00 = (stbtt__hheap *)hh_00->head;
      }
      else {
        hh_00->head = *(stbtt__hheap_chunk **)in_stack_fffffffffffffd80;
        in_stack_fffffffffffffd80[1].x0 = 0.0;
        stbtt__hheap_free((stbtt__hheap *)(local_40 + 8),in_stack_fffffffffffffd80);
      }
    }
    for (; *(float *)(local_10 + 4) <= (float)local_44 + 1.0; local_10 = local_10 + 0x14) {
      if (((*(float *)(local_10 + 4) != *(float *)(local_10 + 0xc)) ||
          (NAN(*(float *)(local_10 + 4)) || NAN(*(float *)(local_10 + 0xc)))) &&
         (in_stack_fffffffffffffd78 =
               stbtt__new_active(hh_00,in_stack_fffffffffffffd80,
                                 (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                                 SUB84(in_stack_fffffffffffffd78,0),
                                 (void *)CONCAT44(in_stack_fffffffffffffd74,
                                                  in_stack_fffffffffffffd70)),
         in_stack_fffffffffffffd78 != (stbtt__active_edge *)0x0)) {
        if (((local_48 == 0) && (local_20 != 0)) && (in_stack_fffffffffffffd78->ey < fVar2)) {
          in_stack_fffffffffffffd78->ey = fVar2;
        }
        in_stack_fffffffffffffd78->next = (stbtt__active_edge *)local_40._0_8_;
        local_40._0_8_ = in_stack_fffffffffffffd78;
      }
    }
    if ((stbtt__active_edge *)local_40._0_8_ != (stbtt__active_edge *)0x0) {
      stbtt__fill_active_edges_new
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                 in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
    }
    in_stack_fffffffffffffd74 = 0.0;
    for (local_4c = 0; local_4c < *local_8; local_4c = local_4c + 1) {
      in_stack_fffffffffffffd74 =
           *(float *)(local_260 + (long)iVar1 * 4 + (long)local_4c * 4) + in_stack_fffffffffffffd74;
      in_stack_fffffffffffffd70 =
           ABS(*(float *)(local_260 + (long)local_4c * 4) + in_stack_fffffffffffffd74) * 255.0 + 0.5
      ;
      in_stack_fffffffffffffd6c = (int)in_stack_fffffffffffffd70;
      if (0xff < in_stack_fffffffffffffd6c) {
        in_stack_fffffffffffffd6c = 0xff;
      }
      *(char *)(*(long *)(local_8 + 4) + (long)(local_48 * local_8[2] + local_4c)) =
           (char)in_stack_fffffffffffffd6c;
    }
    for (psVar3 = (size_t *)local_40; *psVar3 != 0; psVar3 = (size_t *)*psVar3) {
      in_stack_fffffffffffffd60 = (void *)*psVar3;
      *(float *)((long)in_stack_fffffffffffffd60 + 8) =
           *(float *)((long)in_stack_fffffffffffffd60 + 0xc) +
           *(float *)((long)in_stack_fffffffffffffd60 + 8);
    }
    local_44 = local_44 + 1;
  }
  stbtt__hheap_cleanup
            ((stbtt__hheap *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (void *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (local_260 != local_258) {
    ImGui::MemFree(in_stack_fffffffffffffd60);
  }
  return;
}

Assistant:

static void stbtt__rasterize_sorted_edges(stbtt__bitmap *result, stbtt__edge *e, int n, int vsubsample, int off_x, int off_y, void *userdata)
{
   stbtt__hheap hh = { 0, 0, 0 };
   stbtt__active_edge *active = NULL;
   int y,j=0, i;
   float scanline_data[129], *scanline, *scanline2;

   STBTT__NOTUSED(vsubsample);

   if (result->w > 64)
      scanline = (float *) STBTT_malloc((result->w*2+1) * sizeof(float), userdata);
   else
      scanline = scanline_data;

   scanline2 = scanline + result->w;

   y = off_y;
   e[n].y0 = (float) (off_y + result->h) + 1;

   while (j < result->h) {
      // find center of pixel for this scanline
      float scan_y_top    = y + 0.0f;
      float scan_y_bottom = y + 1.0f;
      stbtt__active_edge **step = &active;

      STBTT_memset(scanline , 0, result->w*sizeof(scanline[0]));
      STBTT_memset(scanline2, 0, (result->w+1)*sizeof(scanline[0]));

      // update all active edges;
      // remove all active edges that terminate before the top of this scanline
      while (*step) {
         stbtt__active_edge * z = *step;
         if (z->ey <= scan_y_top) {
            *step = z->next; // delete from list
            STBTT_assert(z->direction);
            z->direction = 0;
            stbtt__hheap_free(&hh, z);
         } else {
            step = &((*step)->next); // advance through list
         }
      }

      // insert all edges that start before the bottom of this scanline
      while (e->y0 <= scan_y_bottom) {
         if (e->y0 != e->y1) {
            stbtt__active_edge *z = stbtt__new_active(&hh, e, off_x, scan_y_top, userdata);
            if (z != NULL) {
               if (j == 0 && off_y != 0) {
                  if (z->ey < scan_y_top) {
                     // this can happen due to subpixel positioning and some kind of fp rounding error i think
                     z->ey = scan_y_top;
                  }
               }
               STBTT_assert(z->ey >= scan_y_top); // if we get really unlucky a tiny bit of an edge can be out of bounds
               // insert at front
               z->next = active;
               active = z;
            }
         }
         ++e;
      }

      // now process all active edges
      if (active)
         stbtt__fill_active_edges_new(scanline, scanline2+1, result->w, active, scan_y_top);

      {
         float sum = 0;
         for (i=0; i < result->w; ++i) {
            float k;
            int m;
            sum += scanline2[i];
            k = scanline[i] + sum;
            k = (float) STBTT_fabs(k)*255 + 0.5f;
            m = (int) k;
            if (m > 255) m = 255;
            result->pixels[j*result->stride + i] = (unsigned char) m;
         }
      }
      // advance all the edges
      step = &active;
      while (*step) {
         stbtt__active_edge *z = *step;
         z->fx += z->fdx; // advance to position for current scanline
         step = &((*step)->next); // advance through list
      }

      ++y;
      ++j;
   }

   stbtt__hheap_cleanup(&hh, userdata);

   if (scanline != scanline_data)
      STBTT_free(scanline, userdata);
}